

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void emit_eobrun(huff_entropy_ptr entropy)

{
  j_compress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  uint uVar3;
  uint size;
  int symbol;
  
  uVar3 = entropy->EOBRUN;
  if (uVar3 != 0) {
    symbol = 0;
    size = 0;
    for (; 1 < uVar3; uVar3 = (int)uVar3 >> 1) {
      size = size + 1;
      symbol = symbol + 0x10;
    }
    if (0xe < size) {
      pjVar1 = entropy->cinfo;
      pjVar2 = pjVar1->err;
      pjVar2->msg_code = 0x29;
      (*pjVar2->error_exit)((j_common_ptr)pjVar1);
    }
    emit_ac_symbol(entropy,entropy->ac_tbl_no,symbol);
    if (size != 0) {
      emit_bits_e(entropy,entropy->EOBRUN,size);
    }
    entropy->EOBRUN = 0;
    emit_buffered_bits(entropy,entropy->bit_buffer,entropy->BE);
    entropy->BE = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_eobrun (huff_entropy_ptr entropy)
{
  register int temp, nbits;

  if (entropy->EOBRUN > 0) {	/* if there is any pending EOBRUN */
    temp = entropy->EOBRUN;
    nbits = 0;
    while ((temp >>= 1))
      nbits++;
    /* safety check: shouldn't happen given limited correction-bit buffer */
    if (nbits > 14)
      ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

    emit_ac_symbol(entropy, entropy->ac_tbl_no, nbits << 4);
    if (nbits)
      emit_bits_e(entropy, entropy->EOBRUN, nbits);

    entropy->EOBRUN = 0;

    /* Emit any buffered correction bits */
    emit_buffered_bits(entropy, entropy->bit_buffer, entropy->BE);
    entropy->BE = 0;
  }
}